

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O2

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_HeaderFieldNodeMissingNameAttribute::RunImpl
          (TestreadFromDocument_HeaderFieldNodeMissingNameAttribute *this)

{
  TestResults *this_00;
  PUGIXML_DOMDocument *this_01;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  string dictionaryXml;
  stringbuf buffer;
  istream is;
  DataDictionary dictionary;
  undefined8 local_5b8;
  undefined8 local_5b0;
  TestDetails local_598;
  long local_578 [13];
  allocator<char> local_510 [280];
  DataDictionary local_3f8 [1000];
  
  FIX::DataDictionary::DataDictionary(local_3f8);
  std::__cxx11::stringbuf::stringbuf((stringbuf *)local_578);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,
             "<fix type=\'FIX\' major=\'4\' minor=\'2\' servicepack=\'0\'><header><field required=\'Y\' /></header><fields><field number=\'8\' name=\'BeginString\' type=\'STRING\' ><value enum=\'1\' description=\'SINGLE_SECURITY\' /></field></fields></fix>"
             ,local_510);
  (**(code **)(local_578[0] + 0x60))(local_578,local_5b8,local_5b0);
  std::istream::istream(local_510,(streambuf *)local_578);
  this_01 = (PUGIXML_DOMDocument *)operator_new(0xd8);
  FIX::PUGIXML_DOMDocument::PUGIXML_DOMDocument(this_01);
  (**(code **)(*(long *)this_01 + 0x10))(this_01,local_510);
  FIX::DataDictionary::readFromDocument((unique_ptr *)local_3f8);
  ppTVar1 = UnitTest::CurrentTest::Results();
  this_00 = *ppTVar1;
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_598,*ppTVar2,0x581);
  UnitTest::TestResults::OnTestFailure
            (this_00,&local_598,"Expected exception: \"ConfigError\" not thrown");
  if (this_01 != (PUGIXML_DOMDocument *)0x0) {
    (**(code **)(*(long *)this_01 + 8))();
  }
  std::istream::~istream(local_510);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::stringbuf::~stringbuf((stringbuf *)local_578);
  FIX::DataDictionary::~DataDictionary(local_3f8);
  return;
}

Assistant:

TEST(readFromDocument_HeaderFieldNodeMissingNameAttribute) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field required='Y' />"  // name attribute missing
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
        "</fields>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}